

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O3

void __thiscall
despot::PlannerBase::DisplayParameters(PlannerBase *this,Option *options,DSPOMDP *model)

{
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *__s;
  string ubtype;
  string lbtype;
  allocator<char> local_59;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  __s = "DEFAULT";
  pcVar5 = "DEFAULT";
  if (options[0x13].desc != (Descriptor *)0x0) {
    pcVar5 = options[0x13].arg;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,pcVar5,(allocator<char> *)&local_58);
  if (options[0x15].desc != (Descriptor *)0x0) {
    __s = options[0x15].arg;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  if (DAT_00192e10 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model = ",8);
    if (model == (DSPOMDP *)0x0) {
      uVar4 = __cxa_bad_typeid();
      if (local_38 != local_28) {
        operator_delete(local_38,local_28[0] + 1);
      }
      _Unwind_Resume(uVar4);
    }
    pcVar5 = *(char **)(model->_vptr_DSPOMDP[-1] + 8) +
             (**(char **)(model->_vptr_DSPOMDP[-1] + 8) == '*');
    sVar1 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Random root seed = ",0x13);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Search depth = ",0xf);
    plVar3 = (long *)std::ostream::operator<<(poVar2,DAT_00192dc0);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Discount = ",0xb);
    poVar2 = std::ostream::_M_insert<double>(DAT_00192dc8);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Simulation steps = ",0x13);
    plVar3 = (long *)std::ostream::operator<<(poVar2,DAT_00192db8);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Number of scenarios = ",0x16);
    plVar3 = (long *)std::ostream::operator<<(poVar2,DAT_00192dbc);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Search time per step = ",0x17);
    poVar2 = std::ostream::_M_insert<double>(Globals::config);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Regularization constant = ",0x1a);
    poVar2 = std::ostream::_M_insert<double>(DAT_00192dd0);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Lower bound = ",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_38,local_30);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Upper bound = ",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_58,local_50);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Policy simulation depth = ",0x1a);
    plVar3 = (long *)std::ostream::operator<<(poVar2,DAT_00192dc4);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Target gap ratio = ",0x13);
    poVar2 = std::ostream::_M_insert<double>(DAT_00192dd8);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void PlannerBase::DisplayParameters(option::Option *options, DSPOMDP *model) {

	string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
	string ubtype = options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
	default_out<< "Model = " << typeid(*model).name() << endl
	<< "Random root seed = " << Globals::config.root_seed << endl
	<< "Search depth = " << Globals::config.search_depth << endl
	<< "Discount = " << Globals::config.discount << endl
	<< "Simulation steps = " << Globals::config.sim_len << endl
	<< "Number of scenarios = " << Globals::config.num_scenarios
	<< endl
	<< "Search time per step = " << Globals::config.time_per_move
	<< endl
	<< "Regularization constant = "
	<< Globals::config.pruning_constant << endl
	<< "Lower bound = " << lbtype << endl
	<< "Upper bound = " << ubtype << endl
	<< "Policy simulation depth = "
	<< Globals::config.max_policy_sim_len << endl
	<< "Target gap ratio = " << Globals::config.xi << endl;
	// << "Solver = " << typeid(*solver).name() << endl << endl;
}